

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype
               (DynamicObject *asyncFromSyncIteratorProtototype,DeferredTypeHandlerBase *typeHandler
               ,DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *asyncFromSyncIteratorProtototype_local;
  
  this = RecyclableObject::GetLibrary(&asyncFromSyncIteratorProtototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb9e,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DeferredTypeHandlerBase::Convert(typeHandler,asyncFromSyncIteratorProtototype,mode,3,0);
  pJVar4 = EnsureAsyncFromSyncIteratorReturnFunction(this);
  AddMember(this,asyncFromSyncIteratorProtototype,0x135,pJVar4,'\x06');
  pJVar4 = EnsureAsyncFromSyncIteratorNextFunction(this);
  AddMember(this,asyncFromSyncIteratorProtototype,0x107,pJVar4,'\x06');
  pJVar4 = EnsureAsyncFromSyncIteratorThrowFunction(this);
  AddMember(this,asyncFromSyncIteratorProtototype,0x16a,pJVar4,'\x06');
  DynamicObject::SetHasNoEnumerableProperties(asyncFromSyncIteratorProtototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype(DynamicObject* asyncFromSyncIteratorProtototype, DeferredTypeHandlerBase* typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = asyncFromSyncIteratorProtototype->GetLibrary();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());
        typeHandler->Convert(asyncFromSyncIteratorProtototype, mode, 3);
        // note per spec this also has a toStringTag but it is not observable at runtime so omitted

        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::return_, library->EnsureAsyncFromSyncIteratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::next, library->EnsureAsyncFromSyncIteratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::throw_, library->EnsureAsyncFromSyncIteratorThrowFunction(), PropertyBuiltInMethodDefaults);

        asyncFromSyncIteratorProtototype->SetHasNoEnumerableProperties(true);

        return true;
    }